

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_hkdf_expand(ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t prk,
                    ptls_iovec_t info)

{
  long lVar1;
  ulong local_a0;
  size_t off_end;
  size_t off_start;
  undefined1 local_88 [7];
  uint8_t gen;
  uint8_t digest [64];
  size_t i;
  ptls_hash_context_t *hmac;
  size_t outlen_local;
  void *output_local;
  ptls_hash_algorithm_t *algo_local;
  ptls_iovec_t prk_local;
  
  i = 0;
  digest[0x38] = '\0';
  digest[0x39] = '\0';
  digest[0x3a] = '\0';
  digest[0x3b] = '\0';
  digest[0x3c] = '\0';
  digest[0x3d] = '\0';
  digest[0x3e] = '\0';
  digest[0x3f] = '\0';
  do {
    if (outlen <= digest._56_8_ * algo->digest_size) {
      if (i != 0) {
        (**(code **)(i + 8))(i,0,0);
      }
      (*ptls_clear_memory)(local_88,algo->digest_size);
      return 0;
    }
    if (i == 0) {
      i = (size_t)ptls_hmac_create(algo,prk.base,prk.len);
      if ((ptls_hash_context_t *)i == (ptls_hash_context_t *)0x0) {
        return 0x201;
      }
    }
    else {
      (**(code **)i)(i,local_88,algo->digest_size);
    }
    (**(code **)i)(i,info.base,info.len);
    off_start._7_1_ = (uint8_t)digest._56_8_ + '\x01';
    (**(code **)i)(i,(long)&off_start + 7,1);
    (**(code **)(i + 8))(i,local_88,1);
    lVar1 = digest._56_8_ * algo->digest_size;
    local_a0 = lVar1 + algo->digest_size;
    if (outlen < local_a0) {
      local_a0 = outlen;
    }
    memcpy((void *)((long)output + lVar1),local_88,local_a0 - lVar1);
    digest._56_8_ = digest._56_8_ + 1;
  } while( true );
}

Assistant:

int ptls_hkdf_expand(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t prk, ptls_iovec_t info)
{
    ptls_hash_context_t *hmac = NULL;
    size_t i;
    uint8_t digest[PTLS_MAX_DIGEST_SIZE];

    for (i = 0; (i * algo->digest_size) < outlen; ++i) {
        if (hmac == NULL) {
            if ((hmac = ptls_hmac_create(algo, prk.base, prk.len)) == NULL)
                return PTLS_ERROR_NO_MEMORY;
        } else {
            hmac->update(hmac, digest, algo->digest_size);
        }
        hmac->update(hmac, info.base, info.len);
        uint8_t gen = (uint8_t)(i + 1);
        hmac->update(hmac, &gen, 1);
        hmac->final(hmac, digest, 1);

        size_t off_start = i * algo->digest_size, off_end = off_start + algo->digest_size;
        if (off_end > outlen)
            off_end = outlen;
        memcpy((uint8_t *)output + off_start, digest, off_end - off_start);
    }

    if (hmac != NULL)
        hmac->final(hmac, NULL, PTLS_HASH_FINAL_MODE_FREE);

    ptls_clear_memory(digest, algo->digest_size);

    return 0;
}